

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.cpp
# Opt level: O3

string * __thiscall
Variable::getBindSimbol_abi_cxx11_(string *__return_storage_ptr__,Variable *this)

{
  pointer pcVar1;
  int iVar2;
  undefined8 *puVar3;
  
  iVar2 = std::__cxx11::string::compare((char *)&this->m_bind_to);
  if (iVar2 != 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (this->m_bind_to)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->m_bind_to)._M_string_length);
    return __return_storage_ptr__;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "var in not bind to sim";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

string Variable::getBindSimbol() {
  if (this->m_bind_to == "0") {
    throw "var in not bind to sim";
  } else {
    return this->m_bind_to;
  }
}